

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

string * __thiscall
testing::internal::MatchMatrix::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MatchMatrix *this)

{
  string *psVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  ulong uVar4;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [112];
  ios_base local_140 [264];
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if (*(long *)this != 0) {
    uVar4 = 0;
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0,__s,sVar2);
      if (*(long *)(this + 8) != 0) {
        uVar3 = 0;
        do {
          std::ostream::_M_insert<bool>(SUB81(local_1b0,0));
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(ulong *)(this + 8));
      }
      uVar4 = uVar4 + 1;
      __s = ";";
    } while (uVar4 < *(ulong *)this);
  }
  psVar1 = local_38;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  return psVar1;
}

Assistant:

string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char *sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}